

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbuildmultiphysicsmesh.cpp
# Opt level: O2

void TPZBuildMultiphysicsMesh::TransferFromMultiPhysicsT<std::complex<double>>
               (TPZVec<TPZCompMesh_*> *cmeshVec,TPZCompMesh *MFMesh)

{
  undefined8 *puVar1;
  uint uVar2;
  undefined8 uVar3;
  TPZFMatrix<std::complex<double>_> *pTVar4;
  TPZFMatrix<std::complex<double>_> *pTVar5;
  TPZConnect *pTVar6;
  int64_t iVar7;
  TPZCompEl *pTVar8;
  TPZCompMesh *pTVar9;
  long lVar10;
  int iVar11;
  int64_t iVar12;
  ulong uVar13;
  int64_t el;
  long lVar14;
  long lVar15;
  TPZVec<std::pair<TPZCompMesh_*,_long>_> indexes;
  TPZVec<std::pair<TPZCompMesh_*,_long>_> local_50;
  
  local_50._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01816478;
  local_50.fStore = (pair<TPZCompMesh_*,_long> *)0x0;
  local_50.fNElements = 0;
  local_50.fNAlloc = 0;
  ComputeAtomicIndexes(MFMesh,&local_50);
  iVar12 = local_50.fNElements;
  pTVar4 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(&MFMesh->fSolution);
  if (iVar12 < 1) {
    iVar12 = 0;
  }
  lVar10 = 0;
  do {
    if (lVar10 == iVar12) {
      lVar10 = (MFMesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
      lVar15 = 0;
      if (lVar10 < 1) {
        lVar10 = lVar15;
      }
      for (; lVar10 != lVar15; lVar15 = lVar15 + 1) {
        pTVar8 = TPZCompMesh::Element(MFMesh,lVar15);
        if ((pTVar8 != (TPZCompEl *)0x0) &&
           (pTVar9 = (TPZCompMesh *)
                     __dynamic_cast(pTVar8,&TPZCompEl::typeinfo,&TPZSubCompMesh::typeinfo,0x918),
           pTVar9 != (TPZCompMesh *)0x0)) {
          TransferFromMultiPhysics(cmeshVec,pTVar9);
        }
      }
      TPZVec<std::pair<TPZCompMesh_*,_long>_>::~TPZVec(&local_50);
      return;
    }
    pTVar9 = local_50.fStore[lVar10].first;
    if (pTVar9 != (TPZCompMesh *)0x0) {
      pTVar5 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(&pTVar9->fSolution);
      pTVar6 = TPZChunkVector<TPZConnect,_10>::operator[]
                         (&(pTVar9->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,
                          local_50.fStore[lVar10].second);
      if (pTVar6->fSequenceNumber < 0) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/pzbuildmultiphysicsmesh.cpp"
                   ,0x1aa);
      }
      iVar11 = (int)pTVar6->fSequenceNumber;
      uVar2 = (pTVar9->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore[iVar11].dim;
      pTVar6 = TPZChunkVector<TPZConnect,_10>::operator[]
                         (&(MFMesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,lVar10);
      lVar15 = pTVar6->fSequenceNumber;
      if (lVar15 < 0) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/pzbuildmultiphysicsmesh.cpp"
                   ,0x1ae);
      }
      if ((int)uVar2 < 1) {
        uVar2 = 0;
      }
      lVar14 = 0;
      for (uVar13 = 0; uVar2 != uVar13; uVar13 = uVar13 + 1) {
        iVar7 = TPZBlock::Index(&MFMesh->fBlock,lVar15,(int)uVar13);
        uVar3 = *(undefined8 *)(pTVar4->fElem[iVar7]._M_value + 8);
        puVar1 = (undefined8 *)
                 (pTVar5->fElem
                  [(pTVar9->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore[iVar11].pos].
                  _M_value + lVar14);
        *puVar1 = *(undefined8 *)pTVar4->fElem[iVar7]._M_value;
        puVar1[1] = uVar3;
        lVar14 = lVar14 + 0x10;
      }
    }
    lVar10 = lVar10 + 1;
  } while( true );
}

Assistant:

void TPZBuildMultiphysicsMesh::TransferFromMultiPhysicsT(TPZVec<TPZCompMesh *> &cmeshVec, TPZCompMesh *MFMesh)
{
    
    TPZVec<atomic_index> indexes;
    ComputeAtomicIndexes(MFMesh, indexes);
    int64_t nconnect = indexes.size();
    TPZBlock &blockMF = MFMesh->Block();
    TPZFMatrix<TVar> &solMF = MFMesh->Solution();
    for(int64_t connect = 0; connect < nconnect; connect++)
    {
        TPZCompMesh *atomic_mesh = indexes[connect].first;
        //TODOCOMPLEX
        if(!atomic_mesh) continue;
        TPZFMatrix<TVar> &atomic_mesh_sol = atomic_mesh->Solution();
        TPZBlock &block = atomic_mesh->Block();
        int64_t atomicindexconnect = indexes[connect].second;
        TPZConnect &con = atomic_mesh->ConnectVec()[atomicindexconnect];
        int64_t seqnum = con.SequenceNumber();
        if(seqnum<0) DebugStop();       /// Whether connect was deleted by previous refined process
        int blsize = block.Size(seqnum);
        TPZConnect &conMF = MFMesh->ConnectVec()[connect];
        int64_t seqnumMF = conMF.SequenceNumber();
        if(seqnumMF < 0) DebugStop();
        for (int idf=0; idf<blsize; idf++) {
            TVar val = solMF(blockMF.Index(seqnumMF, idf));
            int64_t pos = block.Position(seqnum);
            atomic_mesh_sol(pos+idf) = val;
        }
    }
    
    int64_t nel = MFMesh->NElements();
    for (int64_t el = 0; el<nel; el++) {
        TPZCompEl *cel = MFMesh->Element(el);
        TPZSubCompMesh *sub = dynamic_cast<TPZSubCompMesh *>(cel);
        if(sub)
        {
            TransferFromMultiPhysics(cmeshVec, sub);
        }
    }
}